

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void initialization_suite::init_two(void)

{
  size_type *psVar1;
  pointer *ppiVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  iterator iVar6;
  iterator iVar7;
  int *piVar8;
  iterator iVar9;
  iterator iVar10;
  allocator<int> local_189;
  int local_188 [2];
  iterator local_180;
  size_type local_178;
  undefined1 local_170 [8];
  vector<int,_std::allocator<int>_> expect_2;
  circular_view<int,_18446744073709551615UL> span_2;
  allocator<int> local_101;
  int local_100 [2];
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> expect_1;
  circular_view<int,_18446744073709551615UL> span_1;
  allocator<int> local_69;
  int local_68 [2];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0x160000000b;
  psVar1 = &span.member.next;
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar5 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,pvVar3,pvVar4,pvVar5,2);
  local_68[0] = 0xb;
  local_68[1] = 0x16;
  local_60 = local_68;
  local_58 = 2;
  std::allocator<int>::allocator(&local_69);
  __l_01._M_len = local_58;
  __l_01._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,__l_01,&local_69);
  std::allocator<int>::~allocator(&local_69);
  ppiVar2 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar10 = vista::circular_view<int,_18446744073709551615UL>::end
                     ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_50);
  iVar7 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_50)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x940,"void initialization_suite::init_two()",iVar9,iVar10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  psVar1 = &span.member.next;
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar5 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  piVar8 = std::next<int*>(pvVar5,1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)
             &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,pvVar3,pvVar4,piVar8,2);
  local_100[0] = 0x16;
  local_100[1] = 0x21;
  local_f8 = local_100;
  local_f0 = 2;
  std::allocator<int>::allocator(&local_101);
  __l_00._M_len = local_f0;
  __l_00._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e8,__l_00,&local_101);
  std::allocator<int>::~allocator(&local_101);
  ppiVar2 = &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar10 = vista::circular_view<int,_18446744073709551615UL>::end
                     ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_e8);
  iVar7 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_e8)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x947,"void initialization_suite::init_two()",iVar9,iVar10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e8);
  psVar1 = &span.member.next;
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  pvVar5 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  piVar8 = std::next<int*>(pvVar5,2);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)
             &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,pvVar3,pvVar4,piVar8,2);
  local_188[0] = 0x21;
  local_188[1] = 0x2c;
  local_180 = local_188;
  local_178 = 2;
  std::allocator<int>::allocator(&local_189);
  __l._M_len = local_178;
  __l._M_array = local_180;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,__l,&local_189);
  std::allocator<int>::~allocator(&local_189);
  ppiVar2 = &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar9 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar10 = vista::circular_view<int,_18446744073709551615UL>::end
                     ((circular_view<int,_18446744073709551615UL> *)ppiVar2);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_170);
  iVar7 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_170);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x94e,"void initialization_suite::init_two()",iVar9,iVar10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_170);
  return;
}

Assistant:

void init_two()
{
    std::array<int, 4> array = { 11, 22, 33, 44 };
    {
        circular_view<int> span(array.begin(), array.end(), array.begin(), 2);

        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 1), 2);

        std::vector<int> expect = { 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 2), 2);

        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}